

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

int __thiscall
LASreadItemCompressed_GPSTIME11_v1::init(LASreadItemCompressed_GPSTIME11_v1 *this,EVP_PKEY_CTX *ctx)

{
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_GPSTIME11_v1 *this_local;
  
  this->last_gpstime_diff = 0;
  this->multi_extreme_counter = 0;
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_gpstime_multi,(U32 *)0x0);
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_gpstime_0diff,(U32 *)0x0);
  IntegerCompressor::initDecompressor(this->ic_gpstime);
  this->last_gpstime = *(U64I64F64 *)ctx;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

BOOL LASreadItemCompressed_GPSTIME11_v1::init(const U8* item, U32& context)
{
  /* init state */
  last_gpstime_diff = 0;
  multi_extreme_counter = 0;

  /* init models and integer compressors */
  dec->initSymbolModel(m_gpstime_multi);
  dec->initSymbolModel(m_gpstime_0diff);
  ic_gpstime->initDecompressor();

  /* init last item */
  last_gpstime.u64 = *((const U64*)item);
  return TRUE;
}